

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O1

void int32_suite::run(void)

{
  test_zero();
  test_one();
  test_minus_one();
  test_two();
  test_minus_two();
  test_endian();
  test_max();
  test_min();
  fail_missing_one();
  fail_missing_two();
  fail_missing_three();
  fail_missing_four();
  return;
}

Assistant:

void run()
{
    test_zero();
    test_one();
    test_minus_one();
    test_two();
    test_minus_two();
    test_endian();
    test_max();
    test_min();
    fail_missing_one();
    fail_missing_two();
    fail_missing_three();
    fail_missing_four();
}